

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
OpenTypePrimitiveReader::ReadLongDateTime(OpenTypePrimitiveReader *this,longlong *outValue)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Byte buffer;
  Byte buffer_1;
  Byte buffer_2;
  Byte buffer_3;
  Byte buffer_4;
  Byte buffer_5;
  Byte buffer_6;
  Byte buffer_7;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (this->mInternalState == eFailure) {
    return eFailure;
  }
  iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                    (this->mOpenTypeFile,&local_58,1);
  if (CONCAT44(extraout_var,iVar1) == 1) {
    if (this->mInternalState == eFailure) {
      return eFailure;
    }
    iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mOpenTypeFile,&local_57,1);
    if (CONCAT44(extraout_var_00,iVar1) == 1) {
      if (this->mInternalState == eFailure) {
        return eFailure;
      }
      iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                        (this->mOpenTypeFile,&local_56,1);
      if (CONCAT44(extraout_var_01,iVar1) == 1) {
        if (this->mInternalState == eFailure) {
          return eFailure;
        }
        iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                          (this->mOpenTypeFile,&local_55,1);
        if (CONCAT44(extraout_var_02,iVar1) == 1) {
          if (this->mInternalState == eFailure) {
            return eFailure;
          }
          local_38 = (ulong)local_55;
          iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                            (this->mOpenTypeFile,&local_54,1);
          if (CONCAT44(extraout_var_03,iVar1) == 1) {
            if (this->mInternalState == eFailure) {
              return eFailure;
            }
            local_40 = (ulong)local_54;
            iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                              (this->mOpenTypeFile,&local_53,1);
            if (CONCAT44(extraout_var_04,iVar1) == 1) {
              if (this->mInternalState == eFailure) {
                return eFailure;
              }
              local_48 = (ulong)local_53;
              iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                                (this->mOpenTypeFile,&local_52,1);
              if (CONCAT44(extraout_var_05,iVar1) == 1) {
                if (this->mInternalState == eFailure) {
                  return eFailure;
                }
                local_50 = (ulong)local_52;
                iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                                  (this->mOpenTypeFile,&local_51,1);
                if (CONCAT44(extraout_var_06,iVar1) == 1) {
                  *outValue = ((ulong)(uint)((int)local_50 << 8) |
                              (ulong)(uint)((int)local_48 << 0x10) |
                              (ulong)(uint)((int)local_40 << 0x18) |
                              local_38 << 0x20 |
                              (ulong)local_56 << 0x28 |
                              (ulong)local_57 << 0x30 | (ulong)local_58 << 0x38) + (ulong)local_51;
                  return eSuccess;
                }
              }
            }
          }
        }
      }
    }
  }
  this->mInternalState = eFailure;
  return eFailure;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::ReadLongDateTime(long long& outValue)
{
	Byte byte1,byte2,byte3,byte4,byte5,byte6,byte7,byte8;

	if(ReadBYTE(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte3) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte4) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte5) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte6) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte7) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte8) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue =(long long)(	((unsigned long long)byte1 << 56) + ((unsigned long long)byte2 << 48) + 
							((unsigned long long)byte3 << 40) + ((unsigned long long)byte4 << 32) + 
							((unsigned long long)byte5 << 24) + ((unsigned long long)byte6 << 16) + 
							((unsigned long long)byte7 << 8) + byte8);
	return PDFHummus::eSuccess;	
}